

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# loclikely.cpp
# Opt level: O2

int32_t parseTagString(char *localeID,char *lang,int32_t *langLength,char *script,
                      int32_t *scriptLength,char *region,int32_t *regionLength,UErrorCode *err)

{
  char *dest;
  int32_t length;
  uint32_t uVar1;
  size_t sVar2;
  int iVar3;
  undefined1 auVar4 [16];
  char *position;
  byte *local_48;
  char *local_40;
  char *local_38;
  
  auVar4._0_4_ = -(uint)(lang == (char *)0x0);
  auVar4._4_4_ = -(uint)(langLength == (int32_t *)0x0);
  auVar4._8_4_ = -(uint)(script == (char *)0x0);
  auVar4._12_4_ = -(uint)(scriptLength == (int32_t *)0x0);
  iVar3 = movmskps((int)script,auVar4);
  local_48 = (byte *)localeID;
  if ((((iVar3 == 0) && (region != (char *)0x0)) && (regionLength != (int32_t *)0x0)) &&
     (*err < U_ILLEGAL_ARGUMENT_ERROR)) {
    local_40 = region;
    length = ulocimp_getLanguage_63(localeID,lang,*langLength,(char **)&local_48);
    local_38 = localeID;
    u_terminateChars_63(lang,*langLength,length,err);
    localeID = local_38;
    if (*err < U_ILLEGAL_ARGUMENT_ERROR) {
      *langLength = length;
      if (length == 0) {
        builtin_strncpy(lang,"und",4);
        sVar2 = strlen(lang);
        *langLength = (int32_t)sVar2;
      }
      if ((*local_48 == 0x5f) || (*local_48 == 0x2d)) {
        local_48 = local_48 + 1;
      }
      uVar1 = ulocimp_getScript_63((char *)local_48,script,*scriptLength,(char **)&local_48);
      u_terminateChars_63(script,*scriptLength,uVar1,err);
      localeID = local_38;
      if (*err < U_ILLEGAL_ARGUMENT_ERROR) {
        *scriptLength = uVar1;
        if (0 < (int)uVar1) {
          iVar3 = uprv_strnicmp_63(script,"Zzzz",uVar1);
          if (iVar3 == 0) {
            *scriptLength = 0;
          }
          if ((*local_48 == 0x5f) || (*local_48 == 0x2d)) {
            local_48 = local_48 + 1;
          }
        }
        dest = local_40;
        uVar1 = ulocimp_getCountry_63((char *)local_48,local_40,*regionLength,(char **)&local_48);
        u_terminateChars_63(dest,*regionLength,uVar1,err);
        localeID = local_38;
        if (*err < U_ILLEGAL_ARGUMENT_ERROR) {
          *regionLength = uVar1;
          if ((int)uVar1 < 1) {
            if ((*local_48 & 0xbf) != 0) {
              local_48 = local_48 + -1;
            }
          }
          else {
            iVar3 = uprv_strnicmp_63(local_40,"ZZ",uVar1);
            if (iVar3 == 0) {
              *regionLength = 0;
            }
          }
        }
      }
    }
  }
  else if (*err < U_ILLEGAL_ARGUMENT_ERROR) {
    *err = U_ILLEGAL_ARGUMENT_ERROR;
  }
  return (int)local_48 - (int)localeID;
}

Assistant:

static int32_t U_CALLCONV
parseTagString(
    const char* localeID,
    char* lang,
    int32_t* langLength,
    char* script,
    int32_t* scriptLength,
    char* region,
    int32_t* regionLength,
    UErrorCode* err)
{
    const char* position = localeID;
    int32_t subtagLength = 0;

    if(U_FAILURE(*err) ||
       localeID == NULL ||
       lang == NULL ||
       langLength == NULL ||
       script == NULL ||
       scriptLength == NULL ||
       region == NULL ||
       regionLength == NULL) {
        goto error;
    }

    subtagLength = ulocimp_getLanguage(position, lang, *langLength, &position);
    u_terminateChars(lang, *langLength, subtagLength, err);

    /*
     * Note that we explicit consider U_STRING_NOT_TERMINATED_WARNING
     * to be an error, because it indicates the user-supplied tag is
     * not well-formed.
     */
    if(U_FAILURE(*err)) {
        goto error;
    }

    *langLength = subtagLength;

    /*
     * If no language was present, use the value of unknownLanguage
     * instead.  Otherwise, move past any separator.
     */
    if (*langLength == 0) {
        uprv_strcpy(
            lang,
            unknownLanguage);
        *langLength = (int32_t)uprv_strlen(lang);
    }
    if (_isIDSeparator(*position)) {
        ++position;
    }

    subtagLength = ulocimp_getScript(position, script, *scriptLength, &position);
    u_terminateChars(script, *scriptLength, subtagLength, err);

    if(U_FAILURE(*err)) {
        goto error;
    }

    *scriptLength = subtagLength;

    if (*scriptLength > 0) {
        if (uprv_strnicmp(script, unknownScript, *scriptLength) == 0) {
            /**
             * If the script part is the "unknown" script, then don't return it.
             **/
            *scriptLength = 0;
        }

        /*
         * Move past any separator.
         */
        if (_isIDSeparator(*position)) {
            ++position;
        }    
    }

    subtagLength = ulocimp_getCountry(position, region, *regionLength, &position);
    u_terminateChars(region, *regionLength, subtagLength, err);

    if(U_FAILURE(*err)) {
        goto error;
    }

    *regionLength = subtagLength;

    if (*regionLength > 0) {
        if (uprv_strnicmp(region, unknownRegion, *regionLength) == 0) {
            /**
             * If the region part is the "unknown" region, then don't return it.
             **/
            *regionLength = 0;
        }
    } else if (*position != 0 && *position != '@') {
        /* back up over consumed trailing separator */
        --position;
    }

exit:

    return (int32_t)(position - localeID);

error:

    /**
     * If we get here, we have no explicit error, it's the result of an
     * illegal argument.
     **/
    if (!U_FAILURE(*err)) {
        *err = U_ILLEGAL_ARGUMENT_ERROR;
    }

    goto exit;
}